

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  bool bVar6;
  size_t new_size;
  xmlChar *new_buf;
  int inputid;
  size_t maxLength;
  size_t count;
  int l;
  int cur;
  int rl;
  int r;
  int ql;
  int q;
  size_t size_local;
  size_t len_local;
  xmlChar *buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  maxLength = 0;
  iVar2 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar2 = 1000000000;
  }
  iVar1 = ctxt->input->id;
  _ql = size;
  size_local = len;
  len_local = (size_t)buf;
  buf_local = (xmlChar *)ctxt;
  if (buf == (xmlChar *)0x0) {
    size_local = 0;
    _ql = 100;
    len_local = (size_t)(*xmlMallocAtomic)(100);
    if ((void *)len_local == (void *)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)buf_local,(char *)0x0);
      return;
    }
  }
  if ((*(int *)(buf_local + 0x1c4) == 0) &&
     (*(long *)(*(long *)(buf_local + 0x38) + 0x28) - *(long *)(*(long *)(buf_local + 0x38) + 0x20)
      < 0xfa)) {
    xmlGROW((xmlParserCtxtPtr)buf_local);
  }
  r = xmlCurrentChar((xmlParserCtxtPtr)buf_local,&rl);
  if (r == 0) {
LAB_00175aba:
    xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_COMMENT_NOT_FINISHED,
                      "Comment not terminated\n",(xmlChar *)0x0);
    (*xmlFree)((void *)len_local);
  }
  else {
    if (r < 0x100) {
      if (((8 < r) && (r < 0xb)) || ((r == 0xd || (0x1f < r)))) {
LAB_00175441:
        if (**(char **)(*(long *)(buf_local + 0x38) + 0x20) == '\n') {
          *(int *)(*(long *)(buf_local + 0x38) + 0x34) =
               *(int *)(*(long *)(buf_local + 0x38) + 0x34) + 1;
          *(undefined4 *)(*(long *)(buf_local + 0x38) + 0x38) = 1;
        }
        else {
          *(int *)(*(long *)(buf_local + 0x38) + 0x38) =
               *(int *)(*(long *)(buf_local + 0x38) + 0x38) + 1;
        }
        *(long *)(*(long *)(buf_local + 0x38) + 0x20) =
             *(long *)(*(long *)(buf_local + 0x38) + 0x20) + (long)rl;
        cur = xmlCurrentChar((xmlParserCtxtPtr)buf_local,&l);
        if (cur != 0) {
          if (cur < 0x100) {
            if (((cur < 9) || (10 < cur)) && ((cur != 0xd && (cur < 0x20)))) {
LAB_00175520:
              xmlFatalErrMsgInt((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                                "xmlParseComment: invalid xmlChar value %d\n",r);
              (*xmlFree)((void *)len_local);
              return;
            }
          }
          else if ((((cur < 0x100) || (0xd7ff < cur)) && ((cur < 0xe000 || (0xfffd < cur)))) &&
                  ((cur < 0x10000 || (0x10ffff < cur)))) goto LAB_00175520;
          if (**(char **)(*(long *)(buf_local + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf_local + 0x38) + 0x34) =
                 *(int *)(*(long *)(buf_local + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf_local + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf_local + 0x38) + 0x38) =
                 *(int *)(*(long *)(buf_local + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf_local + 0x38) + 0x20) =
               *(long *)(*(long *)(buf_local + 0x38) + 0x20) + (long)l;
          count._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf_local,(int *)&count);
          if (count._4_4_ != 0) {
            do {
              if (count._4_4_ < 0x100) {
                if (((8 < count._4_4_) && (count._4_4_ < 0xb)) ||
                   ((count._4_4_ == 0xd || (bVar6 = false, 0x1f < count._4_4_)))) {
LAB_0017563f:
                  bVar6 = true;
                  if ((count._4_4_ == 0x3e) && (bVar6 = true, cur == 0x2d)) {
                    bVar6 = r != 0x2d;
                  }
                }
              }
              else if ((((0xff < count._4_4_) && (count._4_4_ < 0xd800)) ||
                       ((0xdfff < count._4_4_ && (count._4_4_ < 0xfffe)))) ||
                      ((bVar6 = false, 0xffff < count._4_4_ &&
                       (bVar6 = false, count._4_4_ < 0x110000)))) goto LAB_0017563f;
              if (!bVar6) {
                *(undefined1 *)(len_local + size_local) = 0;
                if (count._4_4_ == 0) {
                  xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_COMMENT_NOT_FINISHED,
                                    "Comment not terminated \n<!--%.50s\n",(xmlChar *)len_local);
                  goto LAB_00175aa8;
                }
                if (count._4_4_ < 0x100) {
                  if (((count._4_4_ < 9) || (10 < count._4_4_)) &&
                     ((count._4_4_ != 0xd && (count._4_4_ < 0x20)))) {
LAB_00175a18:
                    xmlFatalErrMsgInt((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                                      "xmlParseComment: invalid xmlChar value %d\n",count._4_4_);
                    goto LAB_00175aa8;
                  }
                }
                else if ((((count._4_4_ < 0x100) || (0xd7ff < count._4_4_)) &&
                         ((count._4_4_ < 0xe000 || (0xfffd < count._4_4_)))) &&
                        ((count._4_4_ < 0x10000 || (0x10ffff < count._4_4_)))) goto LAB_00175a18;
                if (iVar1 != *(int *)(*(long *)(buf_local + 0x38) + 100)) {
                  xmlFatalErrMsg((xmlParserCtxtPtr)buf_local,XML_ERR_ENTITY_BOUNDARY,
                                 "Comment doesn\'t start and stop in the same entity\n");
                }
                xmlNextChar((xmlParserCtxtPtr)buf_local);
                if (((*(long *)buf_local != 0) && (*(long *)(*(long *)buf_local + 0xa0) != 0)) &&
                   (*(int *)(buf_local + 0x14c) == 0)) {
                  (**(code **)(*(long *)buf_local + 0xa0))(*(undefined8 *)(buf_local + 8),len_local)
                  ;
                }
LAB_00175aa8:
                (*xmlFree)((void *)len_local);
                return;
              }
              if ((cur == 0x2d) && (r == 0x2d)) {
                xmlFatalErr((xmlParserCtxtPtr)buf_local,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
              }
              uVar4 = _ql;
              pvVar5 = (void *)len_local;
              if (_ql <= size_local + 5) {
                uVar4 = _ql << 1;
                pvVar5 = (*xmlRealloc)((void *)len_local,uVar4);
                if (pvVar5 == (void *)0x0) {
                  (*xmlFree)((void *)len_local);
                  xmlErrMemory((xmlParserCtxtPtr)buf_local,(char *)0x0);
                  return;
                }
              }
              len_local = (size_t)pvVar5;
              _ql = uVar4;
              if (rl == 1) {
                *(char *)(len_local + size_local) = (char)r;
                size_local = size_local + 1;
              }
              else {
                iVar3 = xmlCopyCharMultiByte((xmlChar *)(len_local + size_local),r);
                size_local = (long)iVar3 + size_local;
              }
              r = cur;
              rl = l;
              cur = count._4_4_;
              l = (int)count;
              maxLength = maxLength + 1;
              if (0x32 < maxLength) {
                if (((*(int *)(buf_local + 0x1c4) == 0) &&
                    (500 < *(long *)(*(long *)(buf_local + 0x38) + 0x20) -
                           *(long *)(*(long *)(buf_local + 0x38) + 0x18))) &&
                   (*(long *)(*(long *)(buf_local + 0x38) + 0x28) -
                    *(long *)(*(long *)(buf_local + 0x38) + 0x20) < 500)) {
                  xmlSHRINK((xmlParserCtxtPtr)buf_local);
                }
                if ((*(int *)(buf_local + 0x1c4) == 0) &&
                   (*(long *)(*(long *)(buf_local + 0x38) + 0x28) -
                    *(long *)(*(long *)(buf_local + 0x38) + 0x20) < 0xfa)) {
                  xmlGROW((xmlParserCtxtPtr)buf_local);
                }
                maxLength = 0;
                if (*(int *)(buf_local + 0x110) == -1) {
                  (*xmlFree)((void *)len_local);
                  return;
                }
              }
              if (**(char **)(*(long *)(buf_local + 0x38) + 0x20) == '\n') {
                *(int *)(*(long *)(buf_local + 0x38) + 0x34) =
                     *(int *)(*(long *)(buf_local + 0x38) + 0x34) + 1;
                *(undefined4 *)(*(long *)(buf_local + 0x38) + 0x38) = 1;
              }
              else {
                *(int *)(*(long *)(buf_local + 0x38) + 0x38) =
                     *(int *)(*(long *)(buf_local + 0x38) + 0x38) + 1;
              }
              *(long *)(*(long *)(buf_local + 0x38) + 0x20) =
                   *(long *)(*(long *)(buf_local + 0x38) + 0x20) + (long)(int)count;
              count._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf_local,(int *)&count);
              if (count._4_4_ == 0) {
                if (((*(int *)(buf_local + 0x1c4) == 0) &&
                    (500 < *(long *)(*(long *)(buf_local + 0x38) + 0x20) -
                           *(long *)(*(long *)(buf_local + 0x38) + 0x18))) &&
                   (*(long *)(*(long *)(buf_local + 0x38) + 0x28) -
                    *(long *)(*(long *)(buf_local + 0x38) + 0x20) < 500)) {
                  xmlSHRINK((xmlParserCtxtPtr)buf_local);
                }
                if ((*(int *)(buf_local + 0x1c4) == 0) &&
                   (*(long *)(*(long *)(buf_local + 0x38) + 0x28) -
                    *(long *)(*(long *)(buf_local + 0x38) + 0x20) < 0xfa)) {
                  xmlGROW((xmlParserCtxtPtr)buf_local);
                }
                count._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf_local,(int *)&count);
              }
              if ((ulong)(long)iVar2 < size_local) {
                xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_COMMENT_NOT_FINISHED,
                                  "Comment too big found",(xmlChar *)0x0);
                (*xmlFree)((void *)len_local);
                return;
              }
            } while( true );
          }
          count._4_4_ = 0;
        }
        goto LAB_00175aba;
      }
    }
    else if ((((0xff < r) && (r < 0xd800)) || ((0xdfff < r && (r < 0xfffe)))) ||
            ((0xffff < r && (r < 0x110000)))) goto LAB_00175441;
    xmlFatalErrMsgInt((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                      "xmlParseComment: invalid xmlChar value %d\n",r);
    (*xmlFree)((void *)len_local);
  }
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int inputid;

    inputid = ctxt->input->id;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = (xmlChar *) xmlMallocAtomic(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return;
	}
    }
    GROW;	/* Assure there's enough input data */
    q = CUR_CHAR(ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
	if (len + 5 >= size) {
	    xmlChar *new_buf;
            size_t new_size;

	    new_size = size * 2;
	    new_buf = (xmlChar *) xmlRealloc(buf, new_size);
	    if (new_buf == NULL) {
		xmlFree (buf);
		xmlErrMemory(ctxt, NULL);
		return;
	    }
	    buf = new_buf;
            size = new_size;
	}
	COPY_BUF(ql,buf,len,q);
	q = r;
	ql = rl;
	r = cur;
	rl = l;

	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return;
            }
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    SHRINK;
	    GROW;
	    cur = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
	if (inputid != ctxt->input->id) {
	    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
		           "Comment doesn't start and stop in the same"
                           " entity\n");
	}
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    return;
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
    return;
}